

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O2

void __thiscall
ylt::metric::detail::summary_impl<unsigned_int,_6UL>::refresh(summary_impl<unsigned_int,_6UL> *this)

{
  __int_type_conflict _Var1;
  data_t *this_00;
  __int_type_conflict _Var2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  if (0 < (this->refresh_time_).__r) {
    _Var1 = (this->tp_).super___atomic_base<unsigned_long>._M_i;
    _Var2 = std::chrono::_V2::steady_clock::now();
    uVar3 = (_Var2 - _Var1) / 1000000;
    if ((ulong)(this->refresh_time_).__r <= uVar3) {
      LOCK();
      bVar5 = _Var1 == (this->tp_).super___atomic_base<unsigned_long>._M_i;
      if (bVar5) {
        (this->tp_).super___atomic_base<unsigned_long>._M_i = _Var2;
      }
      UNLOCK();
      if (bVar5) {
        if (uVar3 < (ulong)((this->refresh_time_).__r * 2)) {
          uVar3 = (long)(this->frontend_data_index_).super___atomic_base<int>._M_i ^ 1;
          this_00 = (this->data_)._M_elems[uVar3]._M_b._M_p;
          if (this_00 != (data_t *)0x0) {
            data_t::refresh(this_00);
          }
          LOCK();
          (this->frontend_data_index_).super___atomic_base<int>._M_i = (__int_type_conflict2)uVar3;
          UNLOCK();
        }
        else {
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 8) {
            if (*(long *)((long)&(this->data_)._M_elems[0]._M_b._M_p + lVar4) != 0) {
              data_t::refresh(*(data_t **)((long)&(this->data_)._M_elems[0]._M_b._M_p + lVar4));
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void refresh() {
    if (refresh_time_.count() <= 0) {
      return;
    }
    uint64_t old_tp = tp_;
    auto new_tp = std::chrono::steady_clock::now().time_since_epoch().count();
    auto ms = (new_tp - old_tp) / ms_count;
    if (; ms >= refresh_time_.count()) [[unlikely]] {
      if (tp_.compare_exchange_strong(old_tp, new_tp)) {
        if (ms >= 2 * refresh_time_.count()) {
          for (auto& data : data_) {
            if (data != nullptr) {
              data.load()->refresh();
            }
          }
        }
        else {
          auto pos = frontend_data_index_ ^ 1;
          if (auto data = data_[pos].load(); data != nullptr) {
            data->refresh();
          }
          frontend_data_index_ = pos;
        }
      }
    }
  }